

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O1

int __thiscall QuantizeData::initial_blob_max(QuantizeData *this,Mat *data)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  iVar1 = data->c;
  if (0 < (long)iVar1) {
    uVar4 = data->h * data->w;
    pvVar5 = data->data;
    sVar2 = data->cstep;
    sVar3 = data->elemsize;
    fVar8 = this->max_value;
    lVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          fVar9 = ABS(*(float *)((long)pvVar5 + uVar7 * 4));
          if (fVar9 <= fVar8) {
            fVar9 = fVar8;
          }
          fVar8 = fVar9;
          this->max_value = fVar8;
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      lVar6 = lVar6 + 1;
      pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int QuantizeData::initial_blob_max(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            max_value = std::max(max_value, std::fabs(data_n[i]));
        }
    }

    return 0;
}